

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O1

void __thiscall DGlow2::Serialize(DGlow2 *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  
  DSectorEffect::Serialize((DSectorEffect *)this,arc);
  pFVar1 = ::Serialize(arc,"end",&this->m_End,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"maxtics",&this->m_MaxTics,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"oneshot",&this->m_OneShot,(bool *)0x0);
  pFVar1 = ::Serialize(pFVar1,"start",&this->m_Start,(int32_t *)0x0);
  ::Serialize(pFVar1,"tics",&this->m_Tics,(int32_t *)0x0);
  return;
}

Assistant:

void DGlow2::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc("end", m_End)
		("maxtics", m_MaxTics)
		("oneshot", m_OneShot)
		("start", m_Start)
		("tics", m_Tics);
}